

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

bool __thiscall zsummer::log4z::CSem::Wait(CSem *this,int timeout)

{
  int iVar1;
  time_t tVar2;
  timespec ts;
  timespec local_20;
  
  if (timeout < 1) {
    iVar1 = sem_wait((sem_t *)&this->m_semid);
  }
  else {
    tVar2 = time((time_t *)0x0);
    local_20.tv_sec = (ulong)(uint)timeout / 1000 + tVar2;
    local_20.tv_nsec = (long)(((uint)timeout % 1000) * 1000000);
    iVar1 = sem_timedwait((sem_t *)&this->m_semid,&local_20);
  }
  return iVar1 == 0;
}

Assistant:

bool Wait(int timeout = 0)
	{
#ifdef WIN32
		if (timeout <= 0)
		{
			timeout = INFINITE;
		}
		if (WaitForSingleObject(m_hSem, timeout) != WAIT_OBJECT_0)
		{
			return false;
		}
#else
		if (timeout <= 0)
		{
			return (sem_wait(&m_semid) == 0);
		}
		else
		{
			timespec ts;
			ts.tv_sec = time(NULL) + timeout/1000;
			ts.tv_nsec = (timeout%1000)*1000000;
			return (sem_timedwait(&m_semid, &ts) == 0);
		}
#endif
		return true;
	}